

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2cdev.cpp
# Opt level: O0

bool __thiscall I2Cdev::writeBytes(I2Cdev *this,uint16_t regAddr,uint8_t length,uint8_t *data)

{
  FILE *pFVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  __u8 **local_118;
  ushort local_f8 [4];
  i2c_msg msgs [2];
  ushort *local_d0;
  i2c_rdwr_ioctl_data msgset;
  int err;
  int fd;
  uint8_t buf [128];
  int8_t count;
  uint8_t *data_local;
  uint8_t length_local;
  uint16_t regAddr_local;
  I2Cdev *this_local;
  
  if (length < 0x7f) {
    msgset._12_4_ = open(&(this->super_I2Cgeneric).field_0xd,2);
    pFVar1 = _stderr;
    if ((int)msgset._12_4_ < 0) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      fprintf(pFVar1,"Failed to open device: %s\n",pcVar4);
      this_local._7_1_ = true;
    }
    else {
      iVar2 = ioctl(msgset._12_4_,0x703,(ulong)(byte)(this->super_I2Cgeneric).field_0xc);
      pFVar1 = _stderr;
      if (iVar2 < 0) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        fprintf(pFVar1,"Failed to select device: %s\n",pcVar4);
        close(msgset._12_4_);
        this_local._7_1_ = true;
      }
      else {
        err._0_1_ = (undefined1)(regAddr >> 8);
        err._1_1_ = (undefined1)regAddr;
        memcpy((void *)((long)&err + 2),data,(long)(int)((uint)length << 1));
        local_f8[0] = (ushort)(byte)(this->super_I2Cgeneric).field_0xc;
        local_f8[1] = 0;
        local_f8[2] = (ushort)(byte)(length + 2);
        msgs[0]._0_8_ = &err;
        local_118 = &msgs[0].buf;
        do {
          *(undefined2 *)local_118 = 0;
          *(undefined2 *)((long)local_118 + 2) = 0;
          *(undefined2 *)((long)local_118 + 4) = 0;
          local_118[1] = (__u8 *)0x0;
          local_118 = local_118 + 2;
        } while (local_118 != &msgs[1].buf);
        local_d0 = local_f8;
        msgset.msgs._0_4_ = 1;
        msgset.nmsgs = ioctl(msgset._12_4_,0x707,&local_d0);
        close(msgset._12_4_);
        this_local._7_1_ = true;
      }
    }
  }
  else {
    fprintf(_stderr,"Byte write count (%d) > 126\n",(ulong)length);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool I2Cdev::writeBytes(uint16_t regAddr, uint8_t length, uint8_t* data) {
    int8_t count = 0;
    uint8_t buf[128];

    if (length > 126) {
        fprintf(stderr, "Byte write count (%d) > 126\n", length);
        return(FALSE);
    }

    int fd = open(this->i2c_path, O_RDWR);

    if (fd < 0) {
        fprintf(stderr, "Failed to open device: %s\n", strerror(errno));
        return(-1);
    }
    if (ioctl(fd, I2C_SLAVE, this->address) < 0) {
        fprintf(stderr, "Failed to select device: %s\n", strerror(errno));
        close(fd);
        return(-1);
    }

    int err;
    buf[0] = (uint8_t)(regAddr >> 8);
    buf[1] = (uint8_t)(regAddr & 0xff);

    memcpy(buf+2, data, length*2);

    struct i2c_rdwr_ioctl_data msgset;
    struct i2c_msg msgs[2] = {
        {
            .addr = this->address,
            .flags = 0,
            .len = (uint8_t)(2 + length),
            .buf = buf,
        }
    };

    msgset.msgs = msgs;
    msgset.nmsgs = 1;

    err = ioctl(fd, I2C_RDWR, &msgset);
    close(fd);

    return TRUE;
}